

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

bool __thiscall
dxil_spv::CFGStructurizer::loop_exit_supports_infinite_loop
          (CFGStructurizer *this,CFGNode *header,CFGNode *loop_exit)

{
  bool bVar1;
  CFGNode *this_00;
  
  this_00 = get_innermost_loop_header_for(this,header,loop_exit);
  bVar1 = CFGNode::dominates(this_00,header);
  if (bVar1) {
    return false;
  }
  bVar1 = CFGNode::dominates_all_reachable_exits(loop_exit);
  return bVar1;
}

Assistant:

bool CFGStructurizer::loop_exit_supports_infinite_loop(const CFGNode *header, const CFGNode *loop_exit) const
{
	auto *inner_header = get_innermost_loop_header_for(header, loop_exit);
	// A loop exit can exit out to an outer scope such that inner_header dominates the header.
	// If there is no inner loop we can transform the loop exit into a merge block quite easily
	// and avoid the infinite loop.
	if (inner_header->dominates(header))
		return false;

	// We have a candidate. If the candidates dominates all reachable exits, there is never a need to merge later.
	return loop_exit->dominates_all_reachable_exits();
}